

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int r1fgkb_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  double *pdVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  double *pdVar30;
  double *pdVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  double *pdVar35;
  double *pdVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  double *pdVar42;
  int iVar43;
  ulong uVar44;
  double *pdVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  double *pdVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double *local_1a0;
  double *local_198;
  double *local_188;
  double *local_180;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_138;
  double *local_120;
  double *local_118;
  double *local_100;
  double *local_e0;
  double *local_88;
  int local_80;
  int local_7c;
  double *local_60;
  double *local_58;
  double *local_50;
  
  iVar5 = *in1;
  lVar26 = (long)iVar5;
  iVar6 = *ido;
  lVar34 = (long)iVar6;
  iVar7 = *l1;
  lVar39 = (long)iVar7;
  iVar28 = (iVar7 + 1) * iVar6 + 1;
  iVar32 = *ip;
  lVar40 = (long)iVar32;
  lVar27 = (long)(~((iVar32 + 1) * iVar6) * iVar5 + -1);
  iVar8 = *in2;
  lVar17 = (long)iVar8;
  lVar18 = (long)~(iVar28 * iVar8);
  iVar14 = *idl1;
  lVar19 = (long)iVar14;
  dVar56 = cos(6.283185307179586 / (double)iVar32);
  dVar57 = sin(6.283185307179586 / (double)iVar32);
  uVar9 = *ido;
  lVar20 = (long)(int)uVar9;
  iVar16 = *ip;
  uVar11 = iVar16 + 1;
  uVar10 = *l1;
  if ((int)uVar9 < (int)uVar10) {
    if (0 < (int)uVar9) {
      pdVar24 = ch + ((lVar39 + 1) * lVar34 + 1) * lVar17 + lVar18 + 1;
      pdVar31 = cc + ((lVar40 + 1) * lVar34 + 1) * lVar26 + lVar27 + 1;
      lVar29 = 1;
      do {
        pdVar30 = pdVar24;
        lVar48 = (ulong)(uVar10 + 1) - 1;
        pdVar35 = pdVar31;
        if (0 < (int)uVar10) {
          do {
            *pdVar30 = *pdVar35;
            lVar48 = lVar48 + -1;
            pdVar30 = pdVar30 + lVar34 * lVar17;
            pdVar35 = pdVar35 + lVar40 * lVar34 * lVar26;
          } while (lVar48 != 0);
        }
        lVar29 = lVar29 + 1;
        pdVar24 = pdVar24 + lVar17;
        pdVar31 = pdVar31 + lVar26;
      } while (lVar29 != (ulong)uVar9 + 1);
    }
  }
  else if (0 < (int)uVar10) {
    pdVar24 = ch + ((lVar39 + 1) * lVar34 + 1) * lVar17 + lVar18 + 1;
    pdVar31 = cc + ((lVar40 + 1) * lVar34 + 1) * lVar26 + lVar27 + 1;
    lVar29 = 1;
    do {
      pdVar30 = pdVar24;
      lVar48 = (ulong)(uVar9 + 1) - 1;
      pdVar35 = pdVar31;
      if (0 < (int)uVar9) {
        do {
          *pdVar30 = *pdVar35;
          lVar48 = lVar48 + -1;
          pdVar30 = pdVar30 + lVar17;
          pdVar35 = pdVar35 + lVar26;
        } while (lVar48 != 0);
      }
      lVar29 = lVar29 + 1;
      pdVar24 = pdVar24 + lVar34 * lVar17;
      pdVar31 = pdVar31 + lVar40 * lVar34 * lVar26;
    } while (lVar29 != (ulong)uVar10 + 1);
  }
  uVar22 = iVar16 + 2;
  iVar15 = (iVar16 - ((int)uVar11 >> 0x1f)) + 1 >> 1;
  if (2 < iVar16) {
    iVar33 = 2;
    if (2 < iVar15) {
      iVar33 = iVar15;
    }
    pdVar31 = ch + ((((ulong)uVar22 - 2) * lVar39 + 1) * lVar34 + 1) * lVar17 + 1;
    lVar29 = lVar34 * lVar17;
    pdVar24 = ch + ((lVar39 * 2 + 1) * lVar34 + 1) * lVar17 + 1;
    lVar48 = lVar27 * 8 + ((lVar40 + 3) * lVar34 + 1) * lVar26 * 8 + 8;
    lVar49 = lVar34 * lVar26 * 0x10;
    lVar54 = lVar27 * 8 + ((lVar40 + 2) * lVar34 + lVar20) * lVar26 * 8 + 8;
    uVar44 = 2;
    do {
      lVar21 = (ulong)(uVar10 + 1) - 1;
      pdVar30 = pdVar24;
      pdVar35 = pdVar31;
      pdVar42 = cc;
      if (0 < (int)uVar10) {
        do {
          pdVar30[lVar18] =
               *(double *)((long)pdVar42 + lVar54) + *(double *)((long)pdVar42 + lVar54);
          pdVar35[lVar18] =
               *(double *)((long)pdVar42 + lVar48) + *(double *)((long)pdVar42 + lVar48);
          lVar21 = lVar21 + -1;
          pdVar30 = pdVar30 + lVar29;
          pdVar35 = pdVar35 + lVar29;
          pdVar42 = pdVar42 + lVar34 * lVar26 * lVar40;
        } while (lVar21 != 0);
      }
      uVar44 = uVar44 + 1;
      pdVar31 = pdVar31 + -(lVar29 * lVar39);
      pdVar24 = pdVar24 + lVar29 * lVar39;
      lVar48 = lVar48 + lVar49;
      lVar54 = lVar54 + lVar49;
    } while (uVar44 != iVar33 + 1);
  }
  iVar33 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
  if (uVar9 != 1) {
    pdVar31 = cc + lVar27;
    if (iVar33 < (int)uVar10) {
      if (2 < iVar16) {
        iVar53 = 2;
        if (2 < iVar15) {
          iVar53 = iVar15;
        }
        lVar27 = (((ulong)uVar22 - 2) * lVar39 + 1) * lVar34;
        local_160 = ch + (lVar27 + 3) * lVar17 + lVar18 + 1;
        lVar40 = lVar34 * lVar17 * lVar39;
        local_168 = ch + (lVar27 + 2) * lVar17 + lVar18 + 1;
        lVar27 = (lVar39 * 2 + 1) * lVar34;
        local_118 = ch + (lVar27 + 3) * lVar17 + lVar18 + 1;
        local_120 = ch + (lVar27 + 2) * lVar17 + lVar18 + 1;
        iVar12 = (iVar32 + 2) * iVar6;
        iVar37 = (uVar9 + iVar12 + -2) * iVar5;
        iVar4 = iVar5 * iVar6 * 2;
        iVar41 = iVar5 * iVar32 * iVar6;
        iVar12 = (iVar12 + uVar9 + -1) * iVar5;
        iVar13 = (iVar32 + 3) * iVar6;
        iVar32 = (iVar13 + 3) * iVar5;
        iVar13 = (iVar13 + 2) * iVar5;
        uVar44 = 2;
        do {
          if (2 < (int)uVar9) {
            lVar27 = 3;
            pdVar24 = local_118;
            pdVar30 = local_160;
            pdVar35 = local_120;
            pdVar42 = local_168;
            iVar25 = iVar37;
            iVar2 = iVar32;
            iVar1 = iVar12;
            iVar3 = iVar13;
            do {
              if (0 < (int)uVar10) {
                lVar48 = 0;
                lVar29 = (ulong)(uVar10 + 1) - 1;
                iVar52 = iVar3;
                iVar38 = iVar2;
                iVar47 = iVar1;
                iVar43 = iVar25;
                do {
                  *(double *)((long)pdVar35 + lVar48) =
                       pdVar31[(long)iVar52 + 1] + pdVar31[(long)iVar43 + 1];
                  *(double *)((long)pdVar42 + lVar48) =
                       pdVar31[(long)iVar52 + 1] - pdVar31[(long)iVar43 + 1];
                  *(double *)((long)pdVar24 + lVar48) =
                       pdVar31[(long)iVar38 + 1] - pdVar31[(long)iVar47 + 1];
                  *(double *)((long)pdVar30 + lVar48) =
                       pdVar31[(long)iVar38 + 1] + pdVar31[(long)iVar47 + 1];
                  lVar48 = lVar48 + lVar34 * lVar17 * 8;
                  iVar43 = iVar43 + iVar41;
                  iVar47 = iVar47 + iVar41;
                  iVar38 = iVar38 + iVar41;
                  iVar52 = iVar52 + iVar41;
                  lVar29 = lVar29 + -1;
                } while (lVar29 != 0);
              }
              lVar27 = lVar27 + 2;
              pdVar30 = pdVar30 + lVar17 * 2;
              pdVar42 = pdVar42 + lVar17 * 2;
              pdVar24 = pdVar24 + lVar17 * 2;
              pdVar35 = pdVar35 + lVar17 * 2;
              iVar25 = iVar25 + iVar5 * -2;
              iVar1 = iVar1 + iVar5 * -2;
              iVar2 = iVar2 + iVar5 * 2;
              iVar3 = iVar3 + iVar5 * 2;
            } while (lVar27 <= lVar20);
          }
          uVar44 = uVar44 + 1;
          local_160 = local_160 + -lVar40;
          local_168 = local_168 + -lVar40;
          local_118 = local_118 + lVar40;
          local_120 = local_120 + lVar40;
          iVar37 = iVar37 + iVar4;
          iVar12 = iVar12 + iVar4;
          iVar32 = iVar32 + iVar4;
          iVar13 = iVar13 + iVar4;
        } while (uVar44 != iVar53 + 1);
      }
    }
    else if (2 < iVar16) {
      iVar53 = 2;
      if (2 < iVar15) {
        iVar53 = iVar15;
      }
      lVar48 = (((ulong)uVar22 - 2) * lVar39 + 1) * lVar34;
      local_88 = ch + (lVar48 + 3) * lVar17 + lVar18 + 1;
      lVar29 = lVar34 * lVar17;
      lVar49 = lVar29 * lVar39;
      lVar40 = (lVar39 * 2 + 1) * lVar34;
      local_50 = ch + (lVar40 + 3) * lVar17 + lVar18 + 1;
      local_7c = (iVar32 + 3) * iVar6;
      iVar37 = (iVar32 + 2) * iVar6;
      local_80 = (iVar37 + uVar9 + -2) * iVar5;
      local_58 = ch + (lVar40 + 2) * lVar17 + lVar18 + 1;
      local_60 = ch + (lVar48 + 2) * lVar17 + lVar18 + 1;
      lVar40 = lVar26 * 8;
      uVar44 = 2;
      do {
        if (0 < (int)uVar10) {
          uVar50 = 1;
          pdVar24 = local_60;
          pdVar30 = local_58;
          pdVar35 = local_88;
          pdVar42 = local_50;
          iVar13 = local_80;
          iVar12 = local_7c;
          iVar4 = iVar37;
          do {
            if (2 < (int)uVar9) {
              lVar48 = ((long)iVar12 + 3) * lVar40;
              pdVar45 = (double *)
                        ((long)cc +
                        ((long)iVar4 + (long)(int)(uVar9 + 2) + -3) * lVar40 + lVar27 * 8 + 8);
              lVar54 = ((long)iVar12 + 2) * lVar40;
              lVar21 = 3;
              lVar23 = 0;
              pdVar36 = pdVar31;
              iVar41 = iVar13;
              do {
                *(double *)((long)pdVar30 + lVar23) =
                     *(double *)((long)pdVar36 + lVar54 + 8) + pdVar31[(long)iVar41 + 1];
                *(double *)((long)pdVar24 + lVar23) =
                     *(double *)((long)pdVar36 + lVar54 + 8) - pdVar31[(long)iVar41 + 1];
                *(double *)((long)pdVar42 + lVar23) =
                     *(double *)((long)pdVar36 + lVar48 + 8) - *pdVar45;
                *(double *)((long)pdVar35 + lVar23) =
                     *(double *)((long)pdVar36 + lVar48 + 8) + *pdVar45;
                lVar21 = lVar21 + 2;
                lVar23 = lVar23 + lVar17 * 0x10;
                pdVar36 = pdVar36 + lVar26 * 2;
                iVar41 = iVar41 + iVar5 * -2;
                pdVar45 = pdVar45 + lVar26 * -2;
              } while (lVar21 <= lVar20);
            }
            uVar50 = uVar50 + 1;
            pdVar35 = pdVar35 + lVar29;
            pdVar42 = pdVar42 + lVar29;
            iVar12 = iVar12 + iVar32 * iVar6;
            iVar13 = iVar13 + iVar5 * iVar32 * iVar6;
            iVar4 = iVar4 + iVar32 * iVar6;
            pdVar30 = pdVar30 + lVar29;
            pdVar24 = pdVar24 + lVar29;
          } while (uVar50 != uVar10 + 1);
        }
        uVar44 = uVar44 + 1;
        local_88 = local_88 + -lVar49;
        local_50 = local_50 + lVar49;
        local_7c = local_7c + iVar6 * 2;
        local_80 = local_80 + iVar5 * iVar6 * 2;
        iVar37 = iVar37 + iVar6 * 2;
        local_58 = local_58 + lVar49;
        local_60 = local_60 + -lVar49;
      } while (uVar44 != iVar53 + 1);
    }
  }
  lVar40 = (long)~(iVar8 * (iVar14 + 1));
  lVar27 = (long)~((iVar14 + 1) * iVar5);
  if (2 < iVar16) {
    iVar32 = *idl1;
    iVar53 = 3;
    if (3 < iVar15) {
      iVar53 = iVar15;
    }
    iVar37 = 2;
    if (2 < iVar15) {
      iVar37 = iVar15;
    }
    pdVar31 = c2 + (((ulong)uVar22 - 2) * lVar19 + 1) * lVar26 + lVar27;
    pdVar24 = c2 + (lVar19 * 2 + 1) * lVar26 + lVar27;
    lVar29 = (ulong)(iVar32 + 1) - 1;
    dVar58 = 0.0;
    dVar60 = 1.0;
    uVar44 = 2;
    do {
      dVar59 = dVar58 * -dVar57;
      dVar58 = dVar60 * dVar57 + dVar56 * dVar58;
      dVar60 = dVar59 + dVar56 * dVar60;
      if (0 < iVar32) {
        lVar49 = 8;
        lVar48 = lVar29;
        pdVar30 = ch2 + ((long)(iVar16 * iVar14) + 1) * lVar17 + 1;
        pdVar35 = ch2 + ((long)(iVar14 * 2) + 1) * lVar17 + 1;
        pdVar42 = ch2 + (lVar19 + 1) * lVar17 + 1;
        do {
          *(double *)((long)pdVar24 + lVar49) = pdVar35[lVar40] * dVar60 + pdVar42[lVar40];
          *(double *)((long)pdVar31 + lVar49) = pdVar30[lVar40] * dVar58;
          lVar49 = lVar49 + lVar26 * 8;
          pdVar30 = pdVar30 + lVar17;
          pdVar35 = pdVar35 + lVar17;
          pdVar42 = pdVar42 + lVar17;
          lVar48 = lVar48 + -1;
        } while (lVar48 != 0);
      }
      if (4 < iVar16) {
        uVar50 = 3;
        pdVar30 = ch2 + (((ulong)uVar22 - 3) * lVar19 + 1) * lVar17 + lVar40;
        pdVar35 = ch2 + (lVar19 * 3 + 1) * lVar17 + lVar40;
        dVar59 = dVar58;
        dVar62 = dVar60;
        do {
          dVar61 = dVar59 * -dVar58;
          dVar59 = dVar62 * dVar58 + dVar60 * dVar59;
          dVar62 = dVar61 + dVar60 * dVar62;
          if (0 < iVar32) {
            lVar49 = 8;
            lVar54 = 8;
            lVar48 = lVar29;
            do {
              *(double *)((long)pdVar24 + lVar54) =
                   *(double *)((long)pdVar35 + lVar49) * dVar62 +
                   *(double *)((long)pdVar24 + lVar54);
              *(double *)((long)pdVar31 + lVar54) =
                   *(double *)((long)pdVar30 + lVar49) * dVar59 +
                   *(double *)((long)pdVar31 + lVar54);
              lVar54 = lVar54 + lVar26 * 8;
              lVar49 = lVar49 + lVar17 * 8;
              lVar48 = lVar48 + -1;
            } while (lVar48 != 0);
          }
          uVar50 = uVar50 + 1;
          pdVar30 = pdVar30 + -(lVar19 * lVar17);
          pdVar35 = pdVar35 + lVar19 * lVar17;
        } while (uVar50 != iVar53 + 1);
      }
      uVar44 = uVar44 + 1;
      pdVar31 = pdVar31 + -(lVar19 * lVar26);
      pdVar24 = pdVar24 + lVar19 * lVar26;
    } while (uVar44 != iVar37 + 1);
  }
  if (2 < iVar16) {
    iVar32 = *idl1;
    iVar14 = 2;
    if (2 < iVar15) {
      iVar14 = iVar15;
    }
    lVar48 = (lVar19 + 1) * lVar17;
    lVar29 = (lVar19 * 2 + 1) * lVar17 * 8 + 8;
    uVar44 = 2;
    do {
      lVar49 = (ulong)(iVar32 + 1) - 1;
      pdVar31 = ch2 + lVar40;
      if (0 < iVar32) {
        do {
          pdVar31[lVar48 + 1] = *(double *)((long)pdVar31 + lVar29) + pdVar31[lVar48 + 1];
          lVar49 = lVar49 + -1;
          pdVar31 = pdVar31 + lVar17;
        } while (lVar49 != 0);
      }
      uVar44 = uVar44 + 1;
      lVar29 = lVar29 + lVar19 * lVar17 * 8;
    } while (uVar44 != iVar14 + 1);
  }
  lVar29 = (long)~(iVar28 * iVar5);
  if (2 < iVar16) {
    iVar32 = 2;
    if (2 < iVar15) {
      iVar32 = iVar15;
    }
    lVar48 = (((ulong)uVar22 - 2) * lVar39 + 1) * lVar34 + 1;
    pdVar31 = ch + lVar48 * lVar17 + lVar18;
    lVar54 = lVar39 * lVar34 * lVar17;
    pdVar24 = c1 + lVar48 * lVar26 + lVar29;
    lVar49 = lVar39 * lVar34 * lVar26;
    lVar48 = (lVar39 * 2 + 1) * lVar34 + 1;
    pdVar35 = ch + lVar48 * lVar17 + lVar18;
    pdVar30 = c1 + lVar48 * lVar26 + lVar29;
    uVar44 = 2;
    do {
      if (0 < (int)uVar10) {
        lVar21 = 8;
        lVar23 = 8;
        lVar48 = (ulong)(uVar10 + 1) - 1;
        do {
          *(double *)((long)pdVar35 + lVar23) =
               *(double *)((long)pdVar30 + lVar21) - *(double *)((long)pdVar24 + lVar21);
          *(double *)((long)pdVar31 + lVar23) =
               *(double *)((long)pdVar30 + lVar21) + *(double *)((long)pdVar24 + lVar21);
          lVar23 = lVar23 + lVar34 * lVar17 * 8;
          lVar21 = lVar21 + lVar34 * lVar26 * 8;
          lVar48 = lVar48 + -1;
        } while (lVar48 != 0);
      }
      uVar44 = uVar44 + 1;
      pdVar31 = pdVar31 + -lVar54;
      pdVar24 = pdVar24 + -lVar49;
      pdVar35 = pdVar35 + lVar54;
      pdVar30 = pdVar30 + lVar49;
    } while (uVar44 != iVar32 + 1);
  }
  if (uVar9 != 1) {
    if (iVar33 < (int)uVar10) {
      if (2 < iVar16) {
        iVar32 = 2;
        if (2 < iVar15) {
          iVar32 = iVar15;
        }
        lVar21 = (((ulong)uVar22 - 2) * lVar39 + 1) * lVar34;
        lVar48 = lVar21 + 2;
        local_1a0 = c1 + lVar48 * lVar26 + lVar29 + 1;
        lVar54 = lVar39 * lVar34 * lVar26;
        lVar21 = lVar21 + 3;
        lVar23 = (lVar39 * 2 + 1) * lVar34;
        lVar49 = lVar23 + 3;
        lVar23 = lVar23 + 2;
        local_170 = ch + lVar48 * lVar17 + lVar18 + 1;
        lVar48 = lVar39 * lVar34 * lVar17;
        local_188 = ch + lVar21 * lVar17 + lVar18 + 1;
        local_138 = c1 + lVar21 * lVar26 + lVar29 + 1;
        local_160 = ch + lVar49 * lVar17 + lVar18 + 1;
        local_168 = c1 + lVar49 * lVar26 + lVar29 + 1;
        local_118 = ch + lVar23 * lVar17 + lVar18 + 1;
        local_120 = c1 + lVar23 * lVar26 + lVar29 + 1;
        uVar44 = 2;
        do {
          if (2 < (int)uVar9) {
            lVar49 = 3;
            pdVar31 = local_1a0;
            pdVar24 = local_138;
            pdVar30 = local_188;
            pdVar35 = local_168;
            pdVar42 = local_170;
            pdVar36 = local_160;
            pdVar45 = local_120;
            pdVar55 = local_118;
            do {
              if (0 < (int)uVar10) {
                lVar46 = 0;
                lVar23 = 0;
                lVar21 = (ulong)(uVar10 + 1) - 1;
                do {
                  *(double *)((long)pdVar55 + lVar46) =
                       *(double *)((long)pdVar45 + lVar23) - *(double *)((long)pdVar24 + lVar23);
                  *(double *)((long)pdVar42 + lVar46) =
                       *(double *)((long)pdVar45 + lVar23) + *(double *)((long)pdVar24 + lVar23);
                  *(double *)((long)pdVar36 + lVar46) =
                       *(double *)((long)pdVar35 + lVar23) + *(double *)((long)pdVar31 + lVar23);
                  *(double *)((long)pdVar30 + lVar46) =
                       *(double *)((long)pdVar35 + lVar23) - *(double *)((long)pdVar31 + lVar23);
                  lVar23 = lVar23 + lVar34 * lVar26 * 8;
                  lVar46 = lVar46 + lVar34 * lVar17 * 8;
                  lVar21 = lVar21 + -1;
                } while (lVar21 != 0);
              }
              lVar49 = lVar49 + 2;
              pdVar31 = pdVar31 + lVar26 * 2;
              pdVar42 = pdVar42 + lVar17 * 2;
              pdVar30 = pdVar30 + lVar17 * 2;
              pdVar24 = pdVar24 + lVar26 * 2;
              pdVar36 = pdVar36 + lVar17 * 2;
              pdVar35 = pdVar35 + lVar26 * 2;
              pdVar55 = pdVar55 + lVar17 * 2;
              pdVar45 = pdVar45 + lVar26 * 2;
            } while (lVar49 <= lVar20);
          }
          uVar44 = uVar44 + 1;
          local_1a0 = local_1a0 + -lVar54;
          local_170 = local_170 + -lVar48;
          local_188 = local_188 + -lVar48;
          local_138 = local_138 + -lVar54;
          local_160 = local_160 + lVar48;
          local_168 = local_168 + lVar54;
          local_118 = local_118 + lVar48;
          local_120 = local_120 + lVar54;
        } while (uVar44 != iVar32 + 1);
      }
    }
    else if (2 < iVar16) {
      iVar32 = 2;
      if (2 < iVar15) {
        iVar32 = iVar15;
      }
      lVar54 = (lVar39 * 2 + 1) * lVar34;
      lVar48 = lVar54 + 3;
      local_170 = ch + lVar48 * lVar17 + lVar18 + 1;
      lVar46 = lVar39 * lVar34 * lVar17;
      lVar49 = lVar34 * lVar17;
      local_188 = c1 + lVar48 * lVar26 + lVar29 + 1;
      lVar23 = lVar39 * lVar34 * lVar26;
      lVar21 = (((ulong)uVar22 - 2) * lVar39 + 1) * lVar34;
      lVar48 = lVar21 + 3;
      lVar54 = lVar54 + 2;
      lVar21 = lVar21 + 2;
      lVar51 = lVar34 * lVar26;
      local_138 = ch + lVar48 * lVar17 + lVar18 + 1;
      local_160 = c1 + lVar48 * lVar26 + lVar29 + 1;
      local_168 = ch + lVar54 * lVar17 + lVar18 + 1;
      local_118 = c1 + lVar54 * lVar26 + lVar29 + 1;
      local_120 = c1 + lVar21 * lVar26 + lVar29 + 1;
      local_100 = ch + lVar21 * lVar17 + lVar18 + 1;
      uVar44 = 2;
      do {
        if (0 < (int)uVar10) {
          uVar50 = 1;
          pdVar31 = local_188;
          pdVar24 = local_168;
          pdVar30 = local_160;
          pdVar35 = local_138;
          pdVar42 = local_120;
          pdVar36 = local_118;
          pdVar45 = local_100;
          pdVar55 = local_170;
          do {
            if (2 < (int)uVar9) {
              lVar48 = 3;
              lVar21 = 0;
              lVar54 = 0;
              do {
                *(double *)((long)pdVar24 + lVar54) =
                     *(double *)((long)pdVar36 + lVar21) - *(double *)((long)pdVar30 + lVar21);
                *(double *)((long)pdVar45 + lVar54) =
                     *(double *)((long)pdVar36 + lVar21) + *(double *)((long)pdVar30 + lVar21);
                *(double *)((long)pdVar55 + lVar54) =
                     *(double *)((long)pdVar31 + lVar21) + *(double *)((long)pdVar42 + lVar21);
                *(double *)((long)pdVar35 + lVar54) =
                     *(double *)((long)pdVar31 + lVar21) - *(double *)((long)pdVar42 + lVar21);
                lVar48 = lVar48 + 2;
                lVar54 = lVar54 + lVar17 * 0x10;
                lVar21 = lVar21 + lVar26 * 0x10;
              } while (lVar48 <= lVar20);
            }
            uVar50 = uVar50 + 1;
            pdVar55 = pdVar55 + lVar49;
            pdVar31 = pdVar31 + lVar51;
            pdVar35 = pdVar35 + lVar49;
            pdVar30 = pdVar30 + lVar51;
            pdVar24 = pdVar24 + lVar49;
            pdVar36 = pdVar36 + lVar51;
            pdVar42 = pdVar42 + lVar51;
            pdVar45 = pdVar45 + lVar49;
          } while (uVar50 != uVar10 + 1);
        }
        uVar44 = uVar44 + 1;
        local_170 = local_170 + lVar46;
        local_188 = local_188 + lVar23;
        local_138 = local_138 + -lVar46;
        local_160 = local_160 + -lVar23;
        local_168 = local_168 + lVar46;
        local_118 = local_118 + lVar23;
        local_120 = local_120 + -lVar23;
        local_100 = local_100 + -lVar46;
      } while (uVar44 != iVar32 + 1);
    }
    if (uVar9 != 1) {
      uVar44 = (ulong)(uint)*idl1;
      if (0 < *idl1) {
        pdVar31 = c2 + (lVar19 + 1) * lVar26 + lVar27 + 1;
        pdVar24 = ch2 + (lVar19 + 1) * lVar17 + lVar40 + 1;
        do {
          *pdVar31 = *pdVar24;
          pdVar31 = pdVar31 + lVar26;
          pdVar24 = pdVar24 + lVar17;
          uVar44 = uVar44 - 1;
        } while (uVar44 != 0);
      }
      if (1 < iVar16) {
        lVar19 = (lVar39 * 2 + 1) * lVar34 + 1;
        pdVar24 = c1 + lVar19 * lVar26 + lVar29 + 1;
        pdVar31 = ch + lVar19 * lVar17 + lVar18 + 1;
        uVar44 = 2;
        do {
          lVar19 = (ulong)(uVar10 + 1) - 1;
          pdVar30 = pdVar31;
          pdVar35 = pdVar24;
          if (0 < (int)uVar10) {
            do {
              *pdVar35 = *pdVar30;
              lVar19 = lVar19 + -1;
              pdVar30 = pdVar30 + lVar34 * lVar17;
              pdVar35 = pdVar35 + lVar34 * lVar26;
            } while (lVar19 != 0);
          }
          uVar44 = uVar44 + 1;
          pdVar24 = pdVar24 + lVar39 * lVar34 * lVar26;
          pdVar31 = pdVar31 + lVar39 * lVar34 * lVar17;
        } while (uVar44 != uVar11);
      }
      if ((int)uVar10 < iVar33) {
        if (1 < iVar16) {
          lVar19 = (lVar39 * 2 + 1) * lVar34 + 3;
          local_e0 = c1 + lVar19 * lVar26 + lVar29 + 1;
          local_168 = ch + lVar18 + lVar19 * lVar17 + 1;
          iVar14 = (iVar7 * 2 + 1) * iVar6 + 2;
          iVar32 = iVar5 * iVar14;
          iVar14 = iVar14 * iVar8;
          iVar16 = 0;
          uVar44 = 2;
          do {
            if (0 < (int)uVar10) {
              uVar50 = 1;
              local_198 = local_168;
              local_180 = local_e0;
              iVar28 = iVar32;
              iVar15 = iVar14;
              do {
                if (2 < (int)uVar9) {
                  lVar19 = 3;
                  pdVar31 = local_198;
                  pdVar24 = local_180;
                  iVar33 = iVar15;
                  iVar53 = iVar28;
                  do {
                    c1[lVar29 + (long)iVar53 + 1] =
                         wa[(long)iVar16 + lVar19 + -3] * ch[lVar18 + (long)iVar33 + 1] -
                         *pdVar31 * wa[(long)iVar16 + lVar19 + -2];
                    *pdVar24 = wa[(long)iVar16 + lVar19 + -3] * *pdVar31 +
                               wa[(long)iVar16 + lVar19 + -2] * ch[lVar18 + (long)iVar33 + 1];
                    lVar19 = lVar19 + 2;
                    pdVar24 = pdVar24 + lVar26 * 2;
                    pdVar31 = pdVar31 + lVar17 * 2;
                    iVar53 = iVar53 + iVar5 * 2;
                    iVar33 = iVar33 + iVar8 * 2;
                  } while (lVar19 <= lVar20);
                }
                uVar50 = uVar50 + 1;
                local_180 = local_180 + lVar34 * lVar26;
                local_198 = local_198 + lVar34 * lVar17;
                iVar28 = iVar28 + iVar5 * iVar6;
                iVar15 = iVar15 + iVar8 * iVar6;
              } while (uVar50 != uVar10 + 1);
            }
            uVar44 = uVar44 + 1;
            iVar16 = iVar16 + uVar9;
            local_e0 = local_e0 + lVar39 * lVar34 * lVar26;
            local_168 = local_168 + lVar39 * lVar34 * lVar17;
            iVar32 = iVar32 + iVar7 * iVar5 * iVar6;
            iVar14 = iVar14 + iVar7 * iVar8 * iVar6;
          } while (uVar44 != uVar11);
        }
      }
      else if (1 < iVar16) {
        lVar27 = (lVar39 * 2 + 1) * lVar34;
        lVar19 = lVar27 + 3;
        lVar27 = lVar27 + 2;
        local_1a0 = ch + lVar19 * lVar17 + lVar18 + 1;
        lVar40 = lVar39 * lVar34 * lVar17;
        local_170 = ch + lVar27 * lVar17 + lVar18 + 1;
        local_198 = (double *)0x0;
        uVar44 = 2;
        iVar5 = 0;
        do {
          if (2 < (int)uVar9) {
            lVar48 = 3;
            lVar18 = (long)iVar5;
            pdVar31 = local_198;
            pdVar24 = local_1a0;
            pdVar30 = local_170;
            do {
              if (0 < (int)uVar10) {
                lVar21 = 0;
                lVar49 = (ulong)(uVar10 + 1) - 1;
                lVar54 = (long)pdVar31;
                do {
                  *(double *)((long)c1 + lVar54 + lVar29 * 8 + lVar26 * lVar27 * 8 + 8) =
                       wa[lVar18] * *(double *)((long)pdVar30 + lVar21) -
                       *(double *)((long)pdVar24 + lVar21) * wa[lVar18 + 1];
                  *(double *)((long)c1 + lVar54 + lVar29 * 8 + lVar19 * lVar26 * 8 + 8) =
                       wa[lVar18] * *(double *)((long)pdVar24 + lVar21) +
                       wa[lVar18 + 1] * *(double *)((long)pdVar30 + lVar21);
                  lVar54 = lVar54 + lVar34 * lVar26 * 8;
                  lVar21 = lVar21 + lVar34 * lVar17 * 8;
                  lVar49 = lVar49 + -1;
                } while (lVar49 != 0);
              }
              lVar48 = lVar48 + 2;
              pdVar31 = (double *)((long)pdVar31 + lVar26 * 0x10);
              pdVar24 = pdVar24 + lVar17 * 2;
              pdVar30 = pdVar30 + lVar17 * 2;
              lVar18 = lVar18 + 2;
            } while (lVar48 <= lVar20);
          }
          uVar44 = uVar44 + 1;
          iVar5 = iVar5 + uVar9;
          local_198 = (double *)((long)local_198 + lVar39 * lVar34 * lVar26 * 8);
          local_1a0 = local_1a0 + lVar40;
          local_170 = local_170 + lVar40;
        } while (uVar44 != uVar11);
      }
    }
  }
  return 0;
}

Assistant:

int r1fgkb_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    if (*ido < *l1) {
	goto L103;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L101: */
	}
/* L102: */
    }
    goto L106;
L103:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L104: */
	}
/* L105: */
    }
L106:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[(*ido + (
		    j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] + cc[(*
		    ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((j2 -
		    1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((j2
		    - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L1007: */
/* L107: */
	}
/* L108: */
    }
    if (*ido == 1) {
	goto L116;
    }
    if (nbd < *l1) {
	goto L112;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L109: */
	    }
/* L110: */
	}
/* L111: */
    }
    goto L116;
L112:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L113: */
	    }
/* L114: */
	}
/* L115: */
    }
L116:
    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    c2[(ik + l * c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) *
		    ch2_dim1 + 1] + ar1 * ch2[(ik + (ch2_dim2 << 1)) *
		    ch2_dim1 + 1];
	    c2[(ik + lc * c2_dim2) * c2_dim1 + 1] = ai1 * ch2[(ik + *ip *
		    ch2_dim2) * ch2_dim1 + 1];
/* L117: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		c2[(ik + l * c2_dim2) * c2_dim1 + 1] += ar2 * ch2[(ik + j *
			ch2_dim2) * ch2_dim1 + 1];
		c2[(ik + lc * c2_dim2) * c2_dim1 + 1] += ai2 * ch2[(ik + jc *
			ch2_dim2) * ch2_dim1 + 1];
/* L118: */
	    }
/* L119: */
	}
/* L120: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += ch2[(ik + j * ch2_dim2) *
		    ch2_dim1 + 1];
/* L121: */
	}
/* L122: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] - c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j
		    * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] + c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L123: */
	}
/* L124: */
    }
    if (*ido == 1) {
	goto L132;
    }
    if (nbd < *l1) {
	goto L128;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    goto L132;
L128:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L129: */
	    }
/* L130: */
	}
/* L131: */
    }
L132:
    if (*ido == 1) {
	return 0;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L133: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L134: */
	}
/* L135: */
    }
    if (nbd > *l1) {
	goto L139;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L136: */
	    }
/* L137: */
	}
/* L138: */
    }
    goto L143;
L139:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L140: */
	    }
/* L141: */
	}
/* L142: */
    }
L143:
    return 0;
}